

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_sigalgs_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  undefined1 local_90 [8];
  CBB sigalgs_cbb;
  CBB contents;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if (hs->max_version < 0x303) {
    hs_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator!=(&hs->pake_prover,(nullptr_t)0x0);
    if (bVar1) {
      hs_local._7_1_ = true;
    }
    else {
      iVar2 = CBB_add_u16(out_compressible,0xd);
      if ((((iVar2 == 0) ||
           (iVar2 = CBB_add_u16_length_prefixed
                              (out_compressible,(CBB *)((long)&sigalgs_cbb.u + 0x18)), iVar2 == 0))
          || (iVar2 = CBB_add_u16_length_prefixed
                                ((CBB *)((long)&sigalgs_cbb.u + 0x18),(CBB *)local_90), iVar2 == 0))
         || ((bVar1 = tls12_add_verify_sigalgs(hs,(CBB *)local_90), !bVar1 ||
             (iVar2 = CBB_flush(out_compressible), iVar2 == 0)))) {
        hs_local._7_1_ = false;
      }
      else {
        hs_local._7_1_ = true;
      }
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_sigalgs_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                        CBB *out_compressible,
                                        ssl_client_hello_type_t type) {
  if (hs->max_version < TLS1_2_VERSION) {
    return true;
  }
  // In PAKE mode, signature_algorithms is not used.
  if (hs->pake_prover != nullptr) {
    return true;
  }

  CBB contents, sigalgs_cbb;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_signature_algorithms) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &sigalgs_cbb) ||
      !tls12_add_verify_sigalgs(hs, &sigalgs_cbb) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}